

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

string * __thiscall
TextBuffer::get_dot_graph_abi_cxx11_(string *__return_storage_ptr__,TextBuffer *this)

{
  bool bVar1;
  reference ppLVar2;
  ostream *poVar3;
  Text *text;
  string local_218;
  long local_1f8;
  difference_type index;
  Layer *layer_1;
  reverse_iterator end;
  reverse_iterator iter;
  reverse_iterator begin;
  stringstream result;
  ostream local_1c0 [392];
  undefined1 local_38 [8];
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> layers;
  Layer *layer;
  TextBuffer *this_local;
  
  layers.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &this->top_layer->previous_layer;
  std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::vector
            ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_38);
  for (; layers.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
      layers.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           &(*layers.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)->previous_layer) {
    std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::push_back
              ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_38,
               (value_type *)
               &layers.super__Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&begin);
  std::operator<<(local_1c0,"graph { label=\"--- buffer ---\" }\n");
  std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::rbegin
            ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)&iter);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<TextBuffer::Layer_**,_std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>_>_>
  ::reverse_iterator(&end,(reverse_iterator<__gnu_cxx::__normal_iterator<TextBuffer::Layer_**,_std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>_>_>
                           *)&iter);
  std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::rend
            ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)&layer_1);
  while (bVar1 = std::operator!=(&end,(reverse_iterator<__gnu_cxx::__normal_iterator<TextBuffer::Layer_**,_std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>_>_>
                                       *)&layer_1), bVar1) {
    ppLVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<TextBuffer::Layer_**,_std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>_>_>
              ::operator*(&end);
    index = (difference_type)*ppLVar2;
    local_1f8 = std::operator-(&end,&iter);
    poVar3 = std::operator<<(local_1c0,"graph { label=\"layer ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f8);
    poVar3 = std::operator<<(poVar3," (snapshot count ");
    std::ostream::operator<<(poVar3,*(uint *)(index + 0x98));
    if ((Layer *)index == this->base_layer) {
      std::operator<<(local_1c0,", base");
    }
    if ((*(byte *)(index + 0x88) & 1) != 0) {
      std::operator<<(local_1c0,", uses_patch");
    }
    std::operator<<(local_1c0,"):\" }\n");
    bVar1 = ::optional::operator_cast_to_bool((optional *)(index + 0x48));
    if (bVar1) {
      poVar3 = std::operator<<(local_1c0,"graph { label=\"text:\n");
      text = optional<Text>::operator*((optional<Text> *)(index + 0x48));
      poVar3 = ::operator<<(poVar3,text);
      std::operator<<(poVar3,"\" }\n");
    }
    if (0 < local_1f8) {
      Patch::get_dot_graph_abi_cxx11_(&local_218,(Patch *)(index + 8));
      std::operator<<(local_1c0,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<TextBuffer::Layer_**,_std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>_>_>
    ::operator++(&end);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&begin);
  std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::~vector
            ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string TextBuffer::get_dot_graph() const {
  Layer *layer = top_layer;
  vector<Layer *> layers;
  while (layer) {
    layers.push_back(layer);
    layer = layer->previous_layer;
  }

  std::stringstream result;
  result << "graph { label=\"--- buffer ---\" }\n";
  for (auto begin = layers.rbegin(), iter = begin, end = layers.rend();
       iter != end; ++iter) {
    auto layer = *iter;
    auto index = iter - begin;
    result << "graph { label=\"layer " << index << " (snapshot count " << layer->snapshot_count;
    if (layer == base_layer) result << ", base";
    if (layer->uses_patch) result << ", uses_patch";
    result << "):\" }\n";
    if (layer->text) result << "graph { label=\"text:\n" << *layer->text << "\" }\n";
    if (index > 0) result << layer->patch.get_dot_graph();
  }
  return result.str();
}